

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void QPDF::decryptStream(shared_ptr<QPDF::EncryptionParameters> *encp,shared_ptr<InputSource> *file,
                        QPDF *qpdf_for_warning,Pipeline **pipeline,QPDFObjGen og,
                        QPDFObjectHandle *stream_dict,bool is_root_metadata,
                        unique_ptr<Pipeline,_std::default_delete<Pipeline>_> *decrypt_pipeline)

{
  element_type *peVar1;
  Pipeline *pPVar2;
  QPDFObjectHandle *pQVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  encryption_method_e eVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  qpdf_offset_t offset;
  QPDFObjGen QVar9;
  byte bVar10;
  undefined1 use_aes;
  uint uVar11;
  allocator<char> local_1d1;
  QPDFObjectHandle filter;
  QPDFObjectHandle decode_parms;
  string method_source;
  QPDFObjectHandle crypt_params;
  QPDFObjectHandle local_150;
  string key;
  __shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> local_a0;
  QPDFObjectHandle local_90;
  __shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> local_70;
  QPDFObjectHandle local_60;
  string type;
  
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  QVar9 = og;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key,"/Type",(allocator<char> *)&filter);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&method_source,(string *)stream_dict);
  bVar5 = QPDFObjectHandle::isName((QPDFObjectHandle *)&method_source);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&method_source._M_string_length);
  std::__cxx11::string::~string((string *)&key);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&method_source,"/Type",(allocator<char> *)&decode_parms);
    QPDFObjectHandle::getKey(&filter,(string *)stream_dict);
    QPDFObjectHandle::getName_abi_cxx11_(&key,&filter);
    std::__cxx11::string::operator=((string *)&type,(string *)&key);
    std::__cxx11::string::~string((string *)&key);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&filter.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&method_source);
  }
  bVar5 = std::operator==(&type,"/XRef");
  use_aes = (undefined1)QVar9.obj;
  if (bVar5) goto LAB_001ccce0;
  if (((encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      encryption_V < 4) {
    uVar11 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&method_source,"/StmF from /Encrypt dictionary",(allocator<char> *)&key);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key,"/Filter",(allocator<char> *)&crypt_params);
    QPDFObjectHandle::getKey(&decode_parms,(string *)stream_dict);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filter,"/Crypt",(allocator<char> *)&local_150);
    bVar5 = QPDFObjectHandle::isOrHasName(&decode_parms,(string *)&filter);
    std::__cxx11::string::~string((string *)&filter);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&decode_parms.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&key);
    use_aes = (undefined1)QVar9.obj;
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"/DecodeParms",(allocator<char> *)&decode_parms);
      QPDFObjectHandle::getKey(&filter,(string *)stream_dict);
      bVar5 = QPDFObjectHandle::isDictionary(&filter);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&filter.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&key);
      use_aes = (undefined1)QVar9.obj;
      if (!bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"/DecodeParms",(allocator<char> *)&local_150);
        QPDFObjectHandle::getKey(&decode_parms,(string *)stream_dict);
        bVar5 = QPDFObjectHandle::isArray(&decode_parms);
        use_aes = (undefined1)QVar9.obj;
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&filter,"/Filter",&local_1d1)
          ;
          QPDFObjectHandle::getKey(&crypt_params,(string *)stream_dict);
          bVar5 = QPDFObjectHandle::isArray(&crypt_params);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&crypt_params.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&filter);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&decode_parms.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&key);
          use_aes = (undefined1)QVar9.obj;
          if (bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&key,"/Filter",(allocator<char> *)&decode_parms);
            QPDFObjectHandle::getKey(&filter,(string *)stream_dict);
            std::__cxx11::string::~string((string *)&key);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&key,"/DecodeParms",(allocator<char> *)&crypt_params);
            QPDFObjectHandle::getKey(&decode_parms,(string *)stream_dict);
            std::__cxx11::string::~string((string *)&key);
            iVar8 = QPDFObjectHandle::getArrayNItems(&filter);
            iVar7 = QPDFObjectHandle::getArrayNItems(&decode_parms);
            use_aes = (undefined1)QVar9.obj;
            if (iVar8 == iVar7) {
              iVar8 = 0;
              eVar6 = e_unknown;
              while( true ) {
                iVar7 = QPDFObjectHandle::getArrayNItems(&filter);
                use_aes = (undefined1)QVar9.obj;
                if (iVar7 <= iVar8) break;
                QPDFObjectHandle::getArrayItem(&crypt_params,(int)&filter);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&key,"/Crypt",(allocator<char> *)&local_150);
                bVar5 = QPDFObjectHandle::isNameAndEquals(&crypt_params,&key);
                std::__cxx11::string::~string((string *)&key);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&crypt_params.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
                if (bVar5) {
                  QPDFObjectHandle::getArrayItem(&crypt_params,(int)&decode_parms);
                  bVar5 = QPDFObjectHandle::isDictionary(&crypt_params);
                  if (bVar5) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&key,"/Name",&local_1d1);
                    QPDFObjectHandle::getKey(&local_150,(string *)&crypt_params);
                    bVar5 = QPDFObjectHandle::isName(&local_150);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_150.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::__cxx11::string::~string((string *)&key);
                    if (bVar5) {
                      std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_a0,
                                   &encp->
                                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                                  );
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&key,"/Name",(allocator<char> *)&local_150);
                      QPDFObjectHandle::getKey(&local_60,(string *)&crypt_params);
                      eVar6 = interpretCF((shared_ptr<QPDF::EncryptionParameters> *)&local_a0,
                                          &local_60);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&local_60.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      std::__cxx11::string::~string((string *)&key);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&local_a0._M_refcount);
                      std::__cxx11::string::assign((char *)&method_source);
                    }
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&crypt_params.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                }
                iVar8 = iVar8 + 1;
              }
            }
            else {
              eVar6 = e_unknown;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&decode_parms.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            pQVar3 = &filter;
            goto LAB_001cca71;
          }
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&decode_parms.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&key);
        }
        goto LAB_001cca7b;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"/DecodeParms",(allocator<char> *)&filter);
      QPDFObjectHandle::getKey(&decode_parms,(string *)stream_dict);
      std::__cxx11::string::~string((string *)&key);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"/CryptFilterDecodeParms",(allocator<char> *)&crypt_params);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filter,"",(allocator<char> *)&local_150);
      bVar5 = QPDFObjectHandle::isDictionaryOfType(&decode_parms,&key,(string *)&filter);
      std::__cxx11::string::~string((string *)&filter);
      std::__cxx11::string::~string((string *)&key);
      if (bVar5) {
        std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   &encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                  );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"/Name",(allocator<char> *)&filter);
        QPDFObjectHandle::getKey(&local_90,(string *)&decode_parms);
        eVar6 = interpretCF((shared_ptr<QPDF::EncryptionParameters> *)&local_80,&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_90.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&key);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        std::__cxx11::string::assign((char *)&method_source);
      }
      else {
        eVar6 = e_unknown;
      }
      pQVar3 = &decode_parms;
LAB_001cca71:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pQVar3->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (eVar6 == e_unknown) goto LAB_001cca7b;
LAB_001cca9b:
      if ((eVar6 < (e_aesv3|e_unknown)) && ((0x1dU >> (eVar6 & 0x1f) & 1) != 0)) {
        bVar10 = 0x1c >> ((byte)eVar6 & 0x1f);
        uVar11 = (uint)(0x18 >> ((byte)eVar6 & 0x1f));
      }
      else {
        iVar8 = (*((file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  _vptr_InputSource[3])();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filter,"",(allocator<char> *)&local_150);
        offset = InputSource::getLastOffset
                           ((file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &crypt_params,"unknown encryption filter for streams (check ",&method_source)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &decode_parms,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &crypt_params,"); streams may be decrypted improperly");
        QPDFExc::QPDFExc((QPDFExc *)&key,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar8),
                         (string *)&filter,offset,(string *)&decode_parms);
        use_aes = (undefined1)offset;
        warn(qpdf_for_warning,(QPDFExc *)&key);
        QPDFExc::~QPDFExc((QPDFExc *)&key);
        std::__cxx11::string::~string((string *)&decode_parms);
        std::__cxx11::string::~string((string *)&crypt_params);
        std::__cxx11::string::~string((string *)&filter);
        ((encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ->cf_stream = e_aes;
        bVar10 = 1;
        uVar11 = 1;
      }
    }
    else {
LAB_001cca7b:
      peVar1 = (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((!is_root_metadata) || (peVar1->encrypt_metadata != false)) {
        eVar6 = peVar1->cf_stream;
        goto LAB_001cca9b;
      }
      bVar10 = 0;
      uVar11 = 0;
    }
    std::__cxx11::string::~string((string *)&method_source);
    if ((bVar10 & 1) == 0) goto LAB_001ccce0;
  }
  std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,
             &encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>);
  QVar9.obj = uVar11 & 1;
  QVar9.gen = 0;
  getKeyForObject_abi_cxx11_
            (&key,(QPDF *)&local_70,(shared_ptr<QPDF::EncryptionParameters> *)og,QVar9,(bool)use_aes
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  if ((uVar11 & 1) == 0) {
    filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)QUtil::unsigned_char_pointer(&key);
    decode_parms.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)key._M_string_length;
    crypt_params.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                             ((unsigned_long *)&decode_parms);
    std::make_unique<Pl_RC4,char_const(&)[22],Pipeline*&,unsigned_char*,int>
              ((char (*) [22])&method_source,(Pipeline **)"RC4 stream decryption",(uchar **)pipeline
               ,(int *)&filter);
    _Var4 = method_source._M_dataplus;
    method_source._M_dataplus._M_p = (pointer)0x0;
    pPVar2 = (decrypt_pipeline->_M_t).
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
    (decrypt_pipeline->_M_t).super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl = (Pipeline *)_Var4._M_p;
    if (pPVar2 != (Pipeline *)0x0) {
      (*pPVar2->_vptr_Pipeline[1])();
    }
    std::unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_>::~unique_ptr
              ((unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_> *)&method_source);
  }
  else {
    crypt_params.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = (uint)crypt_params.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
                   0xffffff00;
    filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)QUtil::unsigned_char_pointer(&key);
    decode_parms.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)key._M_string_length;
    std::make_unique<Pl_AES_PDF,char_const(&)[22],Pipeline*&,bool,unsigned_char*,unsigned_long>
              ((char (*) [22])&method_source,(Pipeline **)"AES stream decryption",(bool *)pipeline,
               (uchar **)&crypt_params,(unsigned_long *)&filter);
    _Var4 = method_source._M_dataplus;
    method_source._M_dataplus._M_p = (pointer)0x0;
    pPVar2 = (decrypt_pipeline->_M_t).
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
    (decrypt_pipeline->_M_t).super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl = (Pipeline *)_Var4._M_p;
    if (pPVar2 != (Pipeline *)0x0) {
      (*pPVar2->_vptr_Pipeline[1])();
    }
    std::unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_>::~unique_ptr
              ((unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_> *)&method_source);
  }
  *pipeline = (decrypt_pipeline->_M_t).
              super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
              super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
              super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
  std::__cxx11::string::~string((string *)&key);
LAB_001ccce0:
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void
QPDF::decryptStream(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDF& qpdf_for_warning,
    Pipeline*& pipeline,
    QPDFObjGen og,
    QPDFObjectHandle& stream_dict,
    bool is_root_metadata,
    std::unique_ptr<Pipeline>& decrypt_pipeline)
{
    std::string type;
    if (stream_dict.getKey("/Type").isName()) {
        type = stream_dict.getKey("/Type").getName();
    }
    if (type == "/XRef") {
        QTC::TC("qpdf", "QPDF_encryption xref stream from encrypted file");
        return;
    }
    bool use_aes = false;
    if (encp->encryption_V >= 4) {
        encryption_method_e method = e_unknown;
        std::string method_source = "/StmF from /Encrypt dictionary";

        if (stream_dict.getKey("/Filter").isOrHasName("/Crypt")) {
            if (stream_dict.getKey("/DecodeParms").isDictionary()) {
                QPDFObjectHandle decode_parms = stream_dict.getKey("/DecodeParms");
                if (decode_parms.isDictionaryOfType("/CryptFilterDecodeParms")) {
                    QTC::TC("qpdf", "QPDF_encryption stream crypt filter");
                    method = interpretCF(encp, decode_parms.getKey("/Name"));
                    method_source = "stream's Crypt decode parameters";
                }
            } else if (
                stream_dict.getKey("/DecodeParms").isArray() &&
                stream_dict.getKey("/Filter").isArray()) {
                QPDFObjectHandle filter = stream_dict.getKey("/Filter");
                QPDFObjectHandle decode = stream_dict.getKey("/DecodeParms");
                if (filter.getArrayNItems() == decode.getArrayNItems()) {
                    for (int i = 0; i < filter.getArrayNItems(); ++i) {
                        if (filter.getArrayItem(i).isNameAndEquals("/Crypt")) {
                            QPDFObjectHandle crypt_params = decode.getArrayItem(i);
                            if (crypt_params.isDictionary() &&
                                crypt_params.getKey("/Name").isName()) {
                                QTC::TC("qpdf", "QPDF_encrypt crypt array");
                                method = interpretCF(encp, crypt_params.getKey("/Name"));
                                method_source = "stream's Crypt decode parameters (array)";
                            }
                        }
                    }
                }
            }
        }

        if (method == e_unknown) {
            if ((!encp->encrypt_metadata) && is_root_metadata) {
                QTC::TC("qpdf", "QPDF_encryption cleartext metadata");
                method = e_none;
            } else {
                method = encp->cf_stream;
            }
        }
        use_aes = false;
        switch (method) {
        case e_none:
            return;
            break;

        case e_aes:
            use_aes = true;
            break;

        case e_aesv3:
            use_aes = true;
            break;

        case e_rc4:
            break;

        default:
            // filter local to this stream.
            qpdf_for_warning.warn(QPDFExc(
                qpdf_e_damaged_pdf,
                file->getName(),
                "",
                file->getLastOffset(),
                "unknown encryption filter for streams (check " + method_source +
                    "); streams may be decrypted improperly"));
            // To avoid repeated warnings, reset cf_stream.  Assume we'd want to use AES if V == 4.
            encp->cf_stream = e_aes;
            use_aes = true;
            break;
        }
    }
    std::string key = getKeyForObject(encp, og, use_aes);
    if (use_aes) {
        QTC::TC("qpdf", "QPDF_encryption aes decode stream");
        decrypt_pipeline = std::make_unique<Pl_AES_PDF>(
            "AES stream decryption",
            pipeline,
            false,
            QUtil::unsigned_char_pointer(key),
            key.length());
    } else {
        QTC::TC("qpdf", "QPDF_encryption rc4 decode stream");
        decrypt_pipeline = std::make_unique<Pl_RC4>(
            "RC4 stream decryption",
            pipeline,
            QUtil::unsigned_char_pointer(key),
            toI(key.length()));
    }
    pipeline = decrypt_pipeline.get();
}